

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_long>::FindHelper
          (KeyMapBase<unsigned_long> *this,ViewType_conflict1 k)

{
  map_index_t mVar1;
  unsigned_long uVar2;
  NodeAndBucket NVar3;
  KeyMapBase<unsigned_long> *local_38;
  NodeBase *node;
  map_index_t b;
  ViewType_conflict1 k_local;
  KeyMapBase<unsigned_long> *this_local;
  
  AssertLoadFactor(this);
  mVar1 = BucketNumber(this,k);
  local_38 = (KeyMapBase<unsigned_long> *)(this->super_UntypedMapBase).table_[mVar1];
  do {
    if (local_38 == (KeyMapBase<unsigned_long> *)0x0) {
      this_local = (KeyMapBase<unsigned_long> *)0x0;
LAB_003a429d:
      NVar3.bucket = mVar1;
      NVar3.node = (NodeBase *)this_local;
      NVar3._12_4_ = 0;
      return NVar3;
    }
    uVar2 = KeyNode<unsigned_long>::key((KeyNode<unsigned_long> *)local_38);
    uVar2 = TransparentSupport<unsigned_long>::ToView(uVar2);
    if (uVar2 == k) {
      this_local = local_38;
      goto LAB_003a429d;
    }
    local_38 = *(KeyMapBase<unsigned_long> **)&local_38->super_UntypedMapBase;
  } while( true );
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }